

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunVmPass(ExpressionContext *ctx,VmModule *module,VmPassType type)

{
  int iVar1;
  VmFunction *local_48;
  VmFunction *value;
  TraceScope traceScope;
  VmPassType type_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if ((RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token),
     iVar1 != 0)) {
    RunVmPass::token = NULLC::TraceGetToken("InstructionTreeVm","RunVmPass");
    __cxa_guard_release(&RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&value,RunVmPass::token);
  switch(type) {
  case VM_PASS_OPT_PEEPHOLE:
    NULLC::TraceLabel("VM_PASS_OPT_PEEPHOLE");
    break;
  case VM_PASS_OPT_CONSTANT_PROPAGATION:
    NULLC::TraceLabel("VM_PASS_OPT_CONSTANT_PROPAGATION");
    break;
  case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
    NULLC::TraceLabel("VM_PASS_OPT_DEAD_CODE_ELIMINATION");
    break;
  case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
    NULLC::TraceLabel("VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION");
    break;
  case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
    NULLC::TraceLabel("VM_PASS_OPT_LOAD_STORE_PROPAGATION");
    break;
  case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
    NULLC::TraceLabel("VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION");
    break;
  case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
    NULLC::TraceLabel("VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION");
    break;
  case VM_PASS_OPT_MEMORY_TO_REGISTER:
    NULLC::TraceLabel("VM_PASS_OPT_MEMORY_TO_REGISTER");
    break;
  case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
    NULLC::TraceLabel("VM_PASS_OPT_ARRAY_TO_ELEMENTS");
    break;
  case VM_PASS_OPT_LATE_PEEPHOLE:
    NULLC::TraceLabel("VM_PASS_OPT_LATE_PEEPHOLE");
    break;
  case VM_PASS_OPT_FUNCION_INLINING:
    NULLC::TraceLabel("VM_PASS_OPT_FUNCION_INLINING");
    break;
  case VM_PASS_UPDATE_LIVE_SETS:
    NULLC::TraceLabel("VM_PASS_UPDATE_LIVE_SETS");
    break;
  case VM_PASS_PREPARE_SSA_EXIT:
    NULLC::TraceLabel("VM_PASS_PREPARE_SSA_EXIT");
    break;
  case VM_PASS_CREATE_ALLOCA_STORAGE:
    NULLC::TraceLabel("VM_PASS_CREATE_ALLOCA_STORAGE");
    break;
  case VM_PASS_LEGALIZE_ARRAY_VALUES:
    NULLC::TraceLabel("VM_PASS_LEGALIZE_ARRAY_VALUES");
    break;
  case VM_PASS_LEGALIZE_BITCASTS:
    NULLC::TraceLabel("VM_PASS_LEGALIZE_BITCASTS");
    break;
  case VM_PASS_LEGALIZE_EXTRACTS:
    NULLC::TraceLabel("VM_PASS_LEGALIZE_EXTRACTS");
  }
  for (local_48 = (module->functions).head; local_48 != (VmFunction *)0x0; local_48 = local_48->next
      ) {
    if (local_48->firstBlock != (VmBlock *)0x0) {
      switch(type) {
      case VM_PASS_OPT_PEEPHOLE:
        RunPeepholeOptimizations(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_CONSTANT_PROPAGATION:
        RunConstantPropagation(ctx,module,&local_48->super_VmValue,false);
        break;
      case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
        RunDeadCodeElimiation(ctx,module,local_48);
        break;
      case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
        RunControlFlowOptimization(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
        RunLoadStorePropagation(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
        RunCommonSubexpressionElimination(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
        RunDeadAlocaStoreElimination(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_MEMORY_TO_REGISTER:
        RunMemoryToRegister(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
        RunArrayToElements(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_LATE_PEEPHOLE:
        RunLatePeepholeOptimizations(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_OPT_FUNCION_INLINING:
        RunFunctionInlining(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_UPDATE_LIVE_SETS:
        RunUpdateLiveSets(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_PREPARE_SSA_EXIT:
        RunPrepareSsaExit(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_CREATE_ALLOCA_STORAGE:
        RunCreateAllocaStorage(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_LEGALIZE_ARRAY_VALUES:
        RunLegalizeArrayValues(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_LEGALIZE_BITCASTS:
        RunLegalizeBitcasts(ctx,module,&local_48->super_VmValue);
        break;
      case VM_PASS_LEGALIZE_EXTRACTS:
        RunLegalizeExtracts(ctx,module,&local_48->super_VmValue);
      }
      VmFunction::MoveEntryBlockToStart(local_48);
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&value);
  return;
}

Assistant:

void RunVmPass(ExpressionContext &ctx, VmModule *module, VmPassType type)
{
	TRACE_SCOPE("InstructionTreeVm", "RunVmPass");

	switch(type)
	{
	case VM_PASS_OPT_PEEPHOLE:
		TRACE_LABEL("VM_PASS_OPT_PEEPHOLE");
		break;
	case VM_PASS_OPT_CONSTANT_PROPAGATION:
		TRACE_LABEL("VM_PASS_OPT_CONSTANT_PROPAGATION");
		break;
	case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_DEAD_CODE_ELIMINATION");
		break;
	case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
		TRACE_LABEL("VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION");
		break;
	case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
		TRACE_LABEL("VM_PASS_OPT_LOAD_STORE_PROPAGATION");
		break;
	case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION");
		break;
	case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION");
		break;
	case VM_PASS_OPT_MEMORY_TO_REGISTER:
		TRACE_LABEL("VM_PASS_OPT_MEMORY_TO_REGISTER");
		break;
	case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
		TRACE_LABEL("VM_PASS_OPT_ARRAY_TO_ELEMENTS");
		break;
	case VM_PASS_OPT_LATE_PEEPHOLE:
		TRACE_LABEL("VM_PASS_OPT_LATE_PEEPHOLE");
		break;
	case VM_PASS_OPT_FUNCION_INLINING:
		TRACE_LABEL("VM_PASS_OPT_FUNCION_INLINING");
		break;
	case VM_PASS_UPDATE_LIVE_SETS:
		TRACE_LABEL("VM_PASS_UPDATE_LIVE_SETS");
		break;
	case VM_PASS_PREPARE_SSA_EXIT:
		TRACE_LABEL("VM_PASS_PREPARE_SSA_EXIT");
		break;
	case VM_PASS_CREATE_ALLOCA_STORAGE:
		TRACE_LABEL("VM_PASS_CREATE_ALLOCA_STORAGE");
		break;
	case VM_PASS_LEGALIZE_ARRAY_VALUES:
		TRACE_LABEL("VM_PASS_LEGALIZE_ARRAY_VALUES");
		break;
	case VM_PASS_LEGALIZE_BITCASTS:
		TRACE_LABEL("VM_PASS_LEGALIZE_BITCASTS");
		break;
	case VM_PASS_LEGALIZE_EXTRACTS:
		TRACE_LABEL("VM_PASS_LEGALIZE_EXTRACTS");
		break;
	}

	for(VmFunction *value = module->functions.head; value; value = value->next)
	{
		if(!value->firstBlock)
			continue;

		switch(type)
		{
		case VM_PASS_OPT_PEEPHOLE:
			RunPeepholeOptimizations(ctx, module, value);
			break;
		case VM_PASS_OPT_CONSTANT_PROPAGATION:
			RunConstantPropagation(ctx, module, value, false);
			break;
		case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
			RunDeadCodeElimiation(ctx, module, value);
			break;
		case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
			RunControlFlowOptimization(ctx, module, value);
			break;
		case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
			RunLoadStorePropagation(ctx, module, value);
			break;
		case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
			RunCommonSubexpressionElimination(ctx, module, value);
			break;
		case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
			RunDeadAlocaStoreElimination(ctx, module, value);
			break;
		case VM_PASS_OPT_MEMORY_TO_REGISTER:
			RunMemoryToRegister(ctx, module, value);
			break;
		case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
			RunArrayToElements(ctx, module, value);
			break;
		case VM_PASS_OPT_LATE_PEEPHOLE:
			RunLatePeepholeOptimizations(ctx, module, value);
			break;
		case VM_PASS_OPT_FUNCION_INLINING:
			RunFunctionInlining(ctx, module, value);
			break;
		case VM_PASS_UPDATE_LIVE_SETS:
			RunUpdateLiveSets(ctx, module, value);
			break;
		case VM_PASS_PREPARE_SSA_EXIT:
			RunPrepareSsaExit(ctx, module, value);
			break;
		case VM_PASS_CREATE_ALLOCA_STORAGE:
			RunCreateAllocaStorage(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_ARRAY_VALUES:
			RunLegalizeArrayValues(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_BITCASTS:
			RunLegalizeBitcasts(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_EXTRACTS:
			RunLegalizeExtracts(ctx, module, value);
			break;
		}

		// Preserve entry block order for execution
		value->MoveEntryBlockToStart();
	}
}